

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O0

void dump_mmt_buf_as_words_desc(mmt_buf *buf,_func_char_ptr_uint32_t *fun)

{
  char *local_30;
  char *tmp;
  uint32_t *data;
  int j;
  _func_char_ptr_uint32_t *fun_local;
  mmt_buf *buf_local;
  
  for (data._4_4_ = 0; data._4_4_ < buf->len >> 2; data._4_4_ = data._4_4_ + 1) {
    local_30 = (char *)0x0;
    if (fun != (_func_char_ptr_uint32_t *)0x0) {
      local_30 = (*fun)(buf[(long)(int)data._4_4_ + 1].len);
    }
    if (local_30 == (char *)0x0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[(long)(int)data._4_4_ + 1].len);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x\n"," ",(ulong)buf[(long)(int)data._4_4_ + 1].len);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x   [%s]\n",(ulong)buf[(long)(int)data._4_4_ + 1].len,
                local_30);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x   [%s]\n"," ",(ulong)buf[(long)(int)data._4_4_ + 1].len,
                local_30);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words_desc(struct mmt_buf *buf, const char *(*fun)(uint32_t))
{
	int j;
	uint32_t *data = (uint32_t *)buf->data;
	for (j = 0; j < buf->len / 4; ++j)
	{
		const char *tmp = NULL;
		if (fun)
			tmp = fun(data[j]);

		if (tmp)
			mmt_log("        0x%08x   [%s]\n", data[j], tmp);
		else
			mmt_log("        0x%08x\n", data[j]);
	}
}